

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O2

void __thiscall net_uv::KCPSocket::shutdownSocket(KCPSocket *this)

{
  KCPSocketManager *this_00;
  
  releaseKcp(this);
  stopIdle(this);
  this->m_conv = 0;
  this->m_randValue = 0;
  if (this->m_weakRefTag == true) {
    this->m_udp = (uv_udp_t *)0x0;
    if ((this->m_kcpState == CLOSE_WAIT) &&
       ((this->super_Socket).m_closeCall.super__Function_base._M_manager != (_Manager_type)0x0)) {
      std::function<void_(net_uv::Socket_*)>::operator()
                (&(this->super_Socket).m_closeCall,&this->super_Socket);
    }
    changeState(this,CLOSED);
    this_00 = this->m_socketMng;
    this->m_socketMng = (KCPSocketManager *)0x0;
    KCPSocketManager::remove(this_00,(char *)this);
    return;
  }
  if (this->m_udp != (uv_udp_t *)0x0) {
    uv_udp_recv_stop(this->m_udp);
    net_closeHandle((uv_handle_t *)this->m_udp,shutdownSocket::anon_class_1_0_00000001::__invoke);
    return;
  }
  changeState(this,CLOSED);
  return;
}

Assistant:

void KCPSocket::shutdownSocket()
{
	this->releaseKcp();
	this->stopIdle();
	this->setConv(0);
	m_randValue = 0;
	
	if (m_weakRefTag)
	{
		m_udp = NULL;
		if (m_kcpState == State::CLOSE_WAIT && this->m_closeCall != nullptr)
			this->m_closeCall(this);

		this->changeState(State::CLOSED);

		auto mng = m_socketMng;
		m_socketMng = NULL;
		mng->remove(this);
	}
	else
	{
		if (m_udp)
		{
			uv_udp_recv_stop(m_udp);
			net_closeHandle((uv_handle_t*)m_udp, [](uv_handle_t* handle)
			{
				((KCPSocket*)handle->data)->onCloseSocketFinished(handle);
			});
		}
		else
		{
			this->changeState(State::CLOSED);
		}
	}
}